

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

enable_if_t<std::is_base_of<_::acto::actor,_Player>::value,_actor_ref> acto::spawn<Player>(void)

{
  object_t *an_object;
  object_t *in_RDI;
  tuple<acto::actor_*,_std::default_delete<acto::actor>_> local_20;
  __uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_> local_18;
  actor_ref local_10;
  
  local_10.object_ = (object_t *)0x0;
  std::make_unique<Player>();
  local_18._M_t.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl =
       (tuple<acto::actor_*,_std::default_delete<acto::actor>_>)
       (tuple<acto::actor_*,_std::default_delete<acto::actor>_>)
       local_20.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
       super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl;
  an_object = core::make_instance(&local_10,shared,
                                  (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)
                                  &local_18);
  actor_ref::actor_ref((actor_ref *)in_RDI,an_object,false);
  if (local_18._M_t.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
      super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
                          super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl + 8))();
  }
  local_18._M_t.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl =
       (tuple<acto::actor_*,_std::default_delete<acto::actor>_>)
       (_Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>)0x0;
  actor_ref::~actor_ref(&local_10);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Player>::value,_actor_ref>)in_RDI;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(P&&... p) {
  return actor_ref(
    core::make_instance(actor_ref(), actor_thread::shared,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}